

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall
Board::Board(Board *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *values,
            BoardSize size,BoardMode mode)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  BoardSize local_1c;
  
  this->size = size;
  local_1c = size;
  pmVar2 = std::
           map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
           ::at(&Maps::boardSizeInt,&local_1c);
  mVar1 = *pmVar2;
  this->sizeInt = mVar1;
  this->mode = mode;
  this->nullValue = mVar1 * mVar1 - 1;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->values).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (values->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Board::Board( std::vector<size_t>&& values, BoardSize size, BoardMode mode ) : size( size ),
                                                                               mode( mode ),
                                                                               sizeInt( Maps::boardSizeInt.at( size )),
                                                                               values( std::move( values )),
                                                                               nullValue( sizeInt * sizeInt - 1 ) {}